

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

endpoint_type * __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,reactive_socket_service<asio::ip::tcp> *this,
          implementation_type *impl,error_code *ec)

{
  int iVar1;
  int *piVar2;
  uint tmp_addrlen;
  endpoint_type endpoint;
  socklen_t local_38;
  data_union local_34;
  
  local_34._8_4_ = 0;
  local_34._12_4_ = 0;
  local_34._16_4_ = 0;
  local_34._20_4_ = 0;
  local_34.v6.sin6_scope_id = 0;
  local_34._0_8_ = 2;
  iVar1 = (impl->super_base_implementation_type).socket_;
  if (iVar1 == -1) {
    std::error_code::operator=(ec,bad_descriptor);
  }
  else {
    local_38 = 0x1c;
    iVar1 = getpeername(iVar1,(sockaddr *)&local_34.base,&local_38);
    if (iVar1 == 0) {
      ec->_M_value = 0;
      ip::basic_endpoint<asio::ip::tcp>::resize
                ((basic_endpoint<asio::ip::tcp> *)&local_34.base,(ulong)local_38);
      *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0xc) =
           CONCAT44(local_34._16_4_,local_34._12_4_);
      *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 0x14) =
           CONCAT44(local_34.v6.sin6_scope_id,local_34._20_4_);
      *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = local_34._0_8_;
      *(ulong *)((long)&(__return_storage_ptr__->impl_).data_ + 8) =
           CONCAT44(local_34._12_4_,local_34._8_4_);
      return __return_storage_ptr__;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (system_category()::instance == '\0') {
      remote_endpoint();
    }
    ec->_M_value = iVar1;
    ec->_M_cat = (error_category *)&system_category()::instance;
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl_).data_ + 0x10) = 0;
  (__return_storage_ptr__->impl_).data_.v6.sin6_scope_id = 0;
  *(undefined8 *)&(__return_storage_ptr__->impl_).data_ = 2;
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint(const implementation_type& impl,
      asio::error_code& ec) const
  {
    endpoint_type endpoint;
    std::size_t addr_len = endpoint.capacity();
    if (socket_ops::getpeername(impl.socket_,
          endpoint.data(), &addr_len, false, ec))
    {
      ASIO_ERROR_LOCATION(ec);
      return endpoint_type();
    }
    endpoint.resize(addr_len);
    return endpoint;
  }